

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

void __thiscall AActor::Deactivate(AActor *this,AActor *activator)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  FName local_34;
  FState *local_30;
  FState *state;
  TFlags<ActorFlag,_unsigned_int> local_20;
  TFlags<ActorFlag3,_unsigned_int> local_1c;
  AActor *local_18;
  AActor *activator_local;
  AActor *this_local;
  
  iVar1 = (int)this;
  local_18 = activator;
  activator_local = this;
  TFlags<ActorFlag3,_unsigned_int>::operator&
            (&local_1c,iVar1 + (MF3_DONTOVERLAP|MF3_NOSIGHTCHECK|MF3_ALWAYSPUFF|MF3_NORADIUSDMG));
  uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1c);
  bVar3 = false;
  if ((uVar2 != 0) && (bVar3 = true, this->health < 1)) {
    TFlags<ActorFlag,_unsigned_int>::operator&
              (&local_20,iVar1 + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
    uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&local_20);
    bVar3 = uVar2 != 0;
  }
  if (bVar3) {
    TFlags<ActorFlag2,_unsigned_int>::operator&
              ((TFlags<ActorFlag2,_unsigned_int> *)((long)&state + 4),
               iVar1 + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
    uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&state + 4));
    if (uVar2 == 0) {
      TFlags<ActorFlag2,_unsigned_int>::operator|=(&this->flags2,MF2_DORMANT);
      FName::FName(&local_34,NAME_Inactive);
      local_30 = FindState(this,&local_34);
      if (local_30 == (FState *)0x0) {
        this->tics = -1;
      }
      else {
        SetState(this,local_30,false);
      }
    }
  }
  return;
}

Assistant:

void AActor::Deactivate (AActor *activator)
{
	if ((flags3 & MF3_ISMONSTER) && (health > 0 || (flags & MF_ICECORPSE)))
	{
		if (!(flags2 & MF2_DORMANT))
		{
			flags2 |= MF2_DORMANT;
			FState *state = FindState(NAME_Inactive);
			if (state != NULL) 
			{
				SetState(state);
			}
			else
			{
				tics = -1;
			}
		}
	}
}